

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractRoomAction.cpp
# Opt level: O0

ActionResults * __thiscall AbstractRoomAction::Help(AbstractRoomAction *this)

{
  ActionResults *this_00;
  string local_68 [55];
  allocator local_31;
  string local_30 [8];
  string info;
  AbstractRoomAction *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "Command options and structure  \n      _________________________________________________  \n      When typing commands, please remove spaces in item descriptions,\n      for example: green key = greenkey or white pillar = whitepillar.\n      GO _____ | ex: GO NORTH  \n      => takes you to the next room in that direction.  \n      LOOK (or) EXAMINE _____ | ex: LOOK TABLE  \n      => examines an item/object/feature more closely  \n      TOUCH ____ | ex: TOUCH STONE  \n      => Interacts with an item/object/feature  \n      PICKUP (or) TAKE ____ | ex: PICKUP STATUE  \n      => attempts to put an item into your inventory  \n      DROP _____ | ex: DROP PAMPHLET  \n      => drops an item from your inventory to the floor  \n      USE _____ | ex: USE ROPE  \n      => uses an item in a way that you deem natural.  \n      OPEN _____ | ex: OPEN DOOR  \n      => Attempts to open an item/object/feature  \n      CLOSE _____ | ex: CLOSE DOOR  \n      => Attempts to close an item/object/feature  \n      HELP | ex: HELP  \n      => Pretty sure you know what this one does...\n      EXIT or QUIT | ex: QUIT \n      => Again, this one speaks for itself..."
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  this_00 = (ActionResults *)operator_new(0x30);
  std::__cxx11::string::string(local_68,local_30);
  ActionResults::ActionResults(this_00,CURRENT,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return this_00;
}

Assistant:

ActionResults * AbstractRoomAction::Help() {
    std::string info = "Command options and structure  \n"
            "      _________________________________________________  \n"
            "      When typing commands, please remove spaces in item descriptions,\n"
            "      for example: green key = greenkey or white pillar = whitepillar.\n"
            "      GO _____ | ex: GO NORTH  \n"
            "      => takes you to the next room in that direction.  \n"
            "      LOOK (or) EXAMINE _____ | ex: LOOK TABLE  \n"
            "      => examines an item/object/feature more closely  \n"
            "      TOUCH ____ | ex: TOUCH STONE  \n"
            "      => Interacts with an item/object/feature  \n"
            "      PICKUP (or) TAKE ____ | ex: PICKUP STATUE  \n"
            "      => attempts to put an item into your inventory  \n"
            "      DROP _____ | ex: DROP PAMPHLET  \n"
            "      => drops an item from your inventory to the floor  \n"
            "      USE _____ | ex: USE ROPE  \n"
            "      => uses an item in a way that you deem natural.  \n"
            "      OPEN _____ | ex: OPEN DOOR  \n"
            "      => Attempts to open an item/object/feature  \n"
            "      CLOSE _____ | ex: CLOSE DOOR  \n"
            "      => Attempts to close an item/object/feature  \n"
            "      HELP | ex: HELP  \n"
            "      => Pretty sure you know what this one does...\n"
            "      EXIT or QUIT | ex: QUIT \n"
            "      => Again, this one speaks for itself...";

    return new ActionResults(CURRENT,info);
}